

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O0

void __thiscall TcpConnection::~TcpConnection(TcpConnection *this)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  TcpConnection *this_local;
  
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","~TcpConnection",0x22);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                      ,"~TcpConnection",0x22,LOG_LEVEL_INFO,
                      "TcpConnection descontructed, fd is %d\n",this->tc_fd);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  std::function<void_()>::~function(&this->tc_close_cb);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::~function
            (&this->tc_message_cb);
  std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::~function(&this->tc_connected_cb);
  std::any::~any(&this->tc_context);
  InputBuffer::~InputBuffer(&this->tc_ibuf);
  OutputBuffer::~OutputBuffer(&this->tc_obuf);
  std::enable_shared_from_this<TcpConnection>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<TcpConnection>);
  return;
}

Assistant:

TcpConnection::~TcpConnection() {
    LOG_INFO("TcpConnection descontructed, fd is %d\n", tc_fd);
}